

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_gl.cpp
# Opt level: O1

DWORD __thiscall
FNodeBuilder::CheckLoopStart(FNodeBuilder *this,fixed_t dx,fixed_t dy,int vertex,int vertex2)

{
  FPrivVert *pFVar1;
  int iVar2;
  FPrivVert *pFVar3;
  FPrivSeg *pFVar4;
  bool bVar5;
  angle_t aVar6;
  angle_t aVar7;
  uint uVar8;
  uint uVar9;
  DWORD DVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double d_dx;
  double l;
  double d_dy;
  DWORD local_54;
  
  pFVar3 = (this->Vertices).Array;
  pFVar1 = pFVar3 + vertex;
  aVar6 = PointToAngle(dx,dy);
  DVar10 = pFVar3[vertex].segs2;
  local_54 = 0xffffffff;
  uVar9 = 0xffffffff;
  if (DVar10 != 0xffffffff) {
    dVar11 = (double)dx;
    dVar13 = (double)dy;
    local_54 = 0xffffffff;
    do {
      pFVar3 = (this->Vertices).Array;
      pFVar4 = (this->Segs).Array + DVar10;
      aVar7 = PointToAngle(pFVar3[pFVar4->v1].super_FSimpleVert.x - (pFVar1->super_FSimpleVert).x,
                           pFVar3[pFVar4->v1].super_FSimpleVert.y - (pFVar1->super_FSimpleVert).y);
      uVar8 = aVar6 - aVar7;
      if (uVar8 < 5000) {
        pFVar3 = (this->Vertices).Array;
        dVar12 = ((double)(pFVar1->super_FSimpleVert).y -
                 (double)pFVar3[pFVar4->v1].super_FSimpleVert.y) * dVar11 -
                 ((double)(pFVar1->super_FSimpleVert).x -
                 (double)pFVar3[pFVar4->v1].super_FSimpleVert.x) * dVar13;
        if ((17179869184.0 <= ABS(dVar12)) ||
           (bVar5 = true, 42.94967296 <= (dVar12 * dVar12) / (dVar13 * dVar13 + dVar11 * dVar11))) {
          bVar5 = false;
        }
        if (!bVar5) goto LAB_004cc818;
      }
      else {
LAB_004cc818:
        if (uVar8 <= uVar9) {
          uVar9 = uVar8;
          local_54 = DVar10;
        }
      }
      DVar10 = pFVar4->nextforvert2;
    } while (DVar10 != 0xffffffff);
  }
  if (local_54 != 0xffffffff) {
    DVar10 = pFVar1->segs;
    do {
      if (DVar10 == 0xffffffff) {
        return local_54;
      }
      pFVar4 = (this->Segs).Array;
      iVar2 = pFVar4[DVar10].v2;
      if ((iVar2 == vertex2) ||
         ((pFVar3 = (this->Vertices).Array,
          aVar7 = PointToAngle(pFVar3[iVar2].super_FSimpleVert.x - (pFVar1->super_FSimpleVert).x,
                               pFVar3[iVar2].super_FSimpleVert.y - (pFVar1->super_FSimpleVert).y),
          aVar6 - aVar7 < uVar9 && (pFVar4[DVar10].partner != local_54)))) {
        bVar5 = false;
      }
      else {
        DVar10 = pFVar4[DVar10].nextforvert;
        bVar5 = true;
      }
    } while (bVar5);
  }
  return 0xffffffff;
}

Assistant:

DWORD FNodeBuilder::CheckLoopStart (fixed_t dx, fixed_t dy, int vertex, int vertex2)
{
	FPrivVert *v = &Vertices[vertex];
	angle_t splitAngle = PointToAngle (dx, dy);
	DWORD segnum;
	angle_t bestang;
	DWORD bestseg;

	// Find the seg ending at this vertex that forms the smallest angle
	// to the splitter.
	segnum = v->segs2;
	bestang = ANGLE_MAX;
	bestseg = DWORD_MAX;
	while (segnum != DWORD_MAX)
	{
		FPrivSeg *seg = &Segs[segnum];
		angle_t segAngle = PointToAngle (Vertices[seg->v1].x - v->x, Vertices[seg->v1].y - v->y);
		angle_t diff = splitAngle - segAngle;

		if (diff < ANGLE_EPSILON &&
			PointOnSide (Vertices[seg->v1].x, Vertices[seg->v1].y, v->x, v->y, dx, dy) == 0)
		{
			// If a seg lies right on the splitter, don't count it
		}
		else
		{
			if (diff <= bestang)
			{
				bestang = diff;
				bestseg = segnum;
			}
		}
		segnum = seg->nextforvert2;
	}
	if (bestseg == DWORD_MAX)
	{
		return DWORD_MAX;
	}
	// Now make sure there are no segs starting at this vertex that form
	// an even smaller angle to the splitter.
	segnum = v->segs;
	while (segnum != DWORD_MAX)
	{
		FPrivSeg *seg = &Segs[segnum];
		if (seg->v2 == vertex2)
		{
			return DWORD_MAX;
		}
		angle_t segAngle = PointToAngle (Vertices[seg->v2].x - v->x, Vertices[seg->v2].y - v->y);
		angle_t diff = splitAngle - segAngle;
		if (diff < bestang && seg->partner != bestseg)
		{
			return DWORD_MAX;
		}
		segnum = seg->nextforvert;
	}
	return bestseg;
}